

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O1

void __thiscall
PathTracerViewer::Reset(PathTracerViewer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  element_type *peVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkImageMemoryBarrier> __l_00;
  allocator_type local_d9;
  VkClearColorValue local_d8;
  long local_c8;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_b8;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_a0;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::Fence> fence;
  
  this->m_view_type = kColor;
  iVar8 = (*(((this->m_gen_render_pass).
              super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar1 = (this->m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start._0_4_ = peVar1->m_width;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start._4_4_ = peVar1->m_height;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Image::CreateTexture2D
            ((Image *)&local_d8,(Ptr<Device> *)CONCAT44(extraout_var,iVar8),(VkExtent2D *)&local_b8,
             1,VK_FORMAT_R8G8B8A8_UNORM,0x16,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&fence);
  uVar4 = local_d8._8_8_;
  uVar3 = local_d8._0_8_;
  local_d8._0_8_ = 0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&fence);
  local_d8._0_8_ =
       (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8._8_8_ =
       (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
    }
  }
  myvk::ImageView::Create((ImageView *)&fence,(Ptr<ImageBase> *)&local_d8,VK_IMAGE_VIEW_TYPE_2D,1);
  _Var7 = fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar6 = fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar6;
  (this->m_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  myvk::Framebuffer::Create((Framebuffer *)&fence,&this->m_gen_render_pass,&this->m_image_view);
  _Var7 = fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar6 = fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_gen_framebuffer).
           super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_gen_framebuffer).super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)peVar6;
  (this->m_gen_framebuffer).super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  myvk::DescriptorSet::UpdateCombinedImageSampler
            ((this->m_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_sampler,&this->m_image_view,0,0);
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  peVar5 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_c8 = 0;
  local_d8._0_8_ = (void *)0x0;
  local_d8._8_8_ = 0;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::ImageBase::GetMemoryBarrier
            ((VkImageMemoryBarrier *)&fence,
             &((this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  __l._M_len = 1;
  __l._M_array = (iterator)&fence;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (&local_a0,__l,&local_d9);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar5,1,0x1000,(vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_d8,
             &local_b8,&local_a0);
  if (local_a0.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((VkExtent2D)
      local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkExtent2D)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_d8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_d8._0_8_,local_c8 - local_d8._0_8_);
  }
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_d8._0_8_ = 0;
  local_d8._8_8_ = 0;
  myvk::CommandBuffer::CmdClearColorImage
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(Ptr<ImageBase> *)&fence,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_d8);
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  peVar5 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_c8 = 0;
  local_d8._0_8_ = (void *)0x0;
  local_d8._8_8_ = 0;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::ImageBase::GetMemoryBarrier
            ((VkImageMemoryBarrier *)&fence,
             &((this->m_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,0xffffffff,0xffffffff);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&fence;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (&local_a0,__l_00,&local_d9);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar5,0x1000,0x2000,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_d8,&local_b8,
             &local_a0);
  if (local_a0.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((VkExtent2D)
      local_b8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkExtent2D)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_d8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_d8._0_8_,local_c8 - local_d8._0_8_);
  }
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  iVar8 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  myvk::Fence::Create((Fence *)&fence,(Ptr<Device> *)CONCAT44(extraout_var_00,iVar8),0);
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&fence);
  myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    0xffffffffffffffff);
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void PathTracerViewer::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	m_view_type = ViewTypes::kColor;

	m_image = myvk::Image::CreateTexture2D(
	    m_gen_render_pass->GetDevicePtr(), {m_path_tracer_ptr->m_width, m_path_tracer_ptr->m_height}, 1,
	    VK_FORMAT_R8G8B8A8_UNORM,
	    VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT);
	m_image_view = myvk::ImageView::Create(m_image, VK_IMAGE_VIEW_TYPE_2D);
	m_gen_framebuffer = myvk::Framebuffer::Create(m_gen_render_pass, m_image_view);
	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_image_view, 0);

	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                               VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});
	command_buffer->CmdClearColorImage(m_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {m_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL)});
	command_buffer->End();

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
	command_buffer->Submit(fence);
	fence->Wait();
}